

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_xref.c
# Opt level: O2

HPDF_XrefEntry HPDF_Xref_GetEntryByObjectId(HPDF_Xref xref,HPDF_UINT obj_id)

{
  uint uVar1;
  uint uVar2;
  HPDF_Xref xref_00;
  HPDF_XrefEntry p_Var3;
  HPDF_UINT index;
  
  xref_00 = xref;
  while( true ) {
    if (xref_00 == (HPDF_Xref)0x0) {
      return (HPDF_XrefEntry)0x0;
    }
    uVar1 = xref_00->entries->count;
    uVar2 = xref_00->start_offset;
    if (obj_id < uVar2 + uVar1) break;
    index = obj_id - uVar2;
    if (index < uVar1 && (uVar2 <= obj_id && index != 0)) {
      p_Var3 = HPDF_Xref_GetEntry(xref_00,index);
      return p_Var3;
    }
    xref_00 = xref_00->prev;
  }
  HPDF_SetError(xref->error,0x1034,0);
  return (HPDF_XrefEntry)0x0;
}

Assistant:

HPDF_XrefEntry
HPDF_Xref_GetEntryByObjectId  (HPDF_Xref  xref,
                               HPDF_UINT  obj_id)
{
    HPDF_Xref tmp_xref = xref;

    HPDF_PTRACE((" HPDF_Xref_GetEntryByObjectId\n"));

    while (tmp_xref) {
        HPDF_UINT i;

        if (tmp_xref->entries->count + tmp_xref->start_offset > obj_id) {
            HPDF_SetError (xref->error, HPDF_INVALID_OBJ_ID, 0);
            return NULL;
        }

        if (tmp_xref->start_offset < obj_id) {
            for (i = 0; i < tmp_xref->entries->count; i++) {
                if (tmp_xref->start_offset + i == obj_id) {
                    HPDF_XrefEntry entry = HPDF_Xref_GetEntry(tmp_xref, i);

                    return entry;
                }
            }
        }

        tmp_xref = tmp_xref->prev;
    }

    return NULL;
}